

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRReader.cpp
# Opt level: O3

Barcode * __thiscall
ZXing::QRCode::Reader::decode(Barcode *__return_storage_ptr__,Reader *this,BinaryBitmap *image)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Result *pRVar6;
  uint uVar7;
  BarcodeFormat format;
  BarcodeFormat BVar8;
  pointer pRVar9;
  pointer pRVar10;
  DecoderResult decoderResult;
  DetectorResult local_158;
  pointer local_118;
  Result *local_110;
  BitMatrix *local_108;
  undefined1 local_100 [56];
  PointT<int> PStack_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((undefined1  [12])((undefined1  [12])*(this->super_Reader)._opts & (undefined1  [12])0x10) ==
      (undefined1  [12])0x0) {
    (*(this->super_Reader)._vptr_Reader[3])
              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_100,this,image,1);
    FirstOrDefault<std::vector,_ZXing::Result,_std::allocator<ZXing::Result>_>
              (__return_storage_ptr__,
               (vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_100);
    std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
              ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_100);
    return __return_storage_ptr__;
  }
  local_108 = BinaryBitmap::getBitMatrix(image);
  if (local_108 == (BitMatrix *)0x0) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
  local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
  local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
  local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
  local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
  local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
  local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
  local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
  local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._bits._0_8_ = (pointer)0x0;
  local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uVar7 = (((this->super_Reader)._opts)->_formats).i;
  if (uVar7 == 0 || (uVar7 >> 0xd & 1) != 0) {
    local_110 = __return_storage_ptr__;
    DetectPureQR((DetectorResult *)local_100,local_108);
    local_158._bits._width = local_100._0_4_;
    local_158._bits._height = local_100._4_4_;
    local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_100._8_8_;
    local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_100._16_8_;
    local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_100._24_8_;
    local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = local_100._32_4_;
    local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = local_100._36_4_;
    local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = local_100._40_4_;
    local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = local_100._44_4_;
    local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = local_100._48_4_;
    local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = local_100._52_4_;
    local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3] = PStack_c8;
    uVar7 = (((this->super_Reader)._opts)->_formats).i;
    local_118 = (pointer)local_100._24_8_;
    pRVar9 = (pointer)local_100._8_8_;
    pRVar10 = (pointer)local_100._16_8_;
    pRVar6 = local_110;
    if (((uVar7 == 0 | (byte)(uVar7 >> 0x10)) & local_100._8_8_ == local_100._16_8_) != 0) {
LAB_0018a4f1:
      local_110 = pRVar6;
      puVar3 = local_158._bits._bits.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar2 = local_158._bits._bits.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar1 = local_158._bits._bits.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      DetectPureMQR((DetectorResult *)local_100,local_108);
      pRVar10 = (pointer)local_100._16_8_;
      pRVar9 = (pointer)local_100._8_8_;
      local_158._bits._width = local_100._0_4_;
      local_158._bits._height = local_100._4_4_;
      local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_100._8_8_;
      local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_100._16_8_;
      local_118 = (pointer)local_100._24_8_;
      local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_100._24_8_;
      local_100._8_8_ = (pointer)0x0;
      local_100._16_8_ = (pointer)0x0;
      local_100._24_8_ = (pointer)0x0;
      if ((pointer)puVar2 == (pointer)0x0) {
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = local_100._48_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = local_100._52_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3] = PStack_c8;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = local_100._32_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = local_100._36_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = local_100._40_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = local_100._44_4_;
      }
      else {
        operator_delete(puVar1,(long)puVar3 - (long)puVar2);
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = local_100._32_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = local_100._36_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = local_100._40_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = local_100._44_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = local_100._48_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = local_100._52_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3] = PStack_c8;
        if ((pointer)local_100._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_100._8_8_,local_100._24_8_ - local_100._8_8_);
        }
      }
      uVar7 = (((this->super_Reader)._opts)->_formats).i;
    }
    __return_storage_ptr__ = local_110;
    if ((uVar7 == 0 || (uVar7 >> 0x11 & 1) != 0) && (pRVar9 == pRVar10)) {
LAB_0018a5d0:
      DetectPureRMQR((DetectorResult *)local_100,local_108);
      uVar5 = local_100._16_8_;
      uVar4 = local_100._8_8_;
      local_158._bits._width = local_100._0_4_;
      local_158._bits._height = local_100._4_4_;
      local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_100._8_8_;
      local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_100._16_8_;
      local_158._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_100._24_8_;
      local_100._8_8_ = (pointer)0x0;
      local_100._16_8_ = (pointer)0x0;
      local_100._24_8_ = (pointer)0x0;
      if (pRVar10 == (pointer)0x0) {
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = local_100._48_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = local_100._52_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3] = PStack_c8;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = local_100._32_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = local_100._36_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = local_100._40_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = local_100._44_4_;
        pRVar9 = (pointer)uVar4;
        pRVar10 = (pointer)uVar5;
      }
      else {
        operator_delete(pRVar9,(long)local_118 - (long)pRVar10);
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = local_100._32_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = local_100._36_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = local_100._40_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = local_100._44_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = local_100._48_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = local_100._52_4_;
        local_158._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3] = PStack_c8;
        pRVar9 = (pointer)local_158._bits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        pRVar10 = (pointer)local_158._bits._bits.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
        if ((pointer)local_100._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_100._8_8_,local_100._24_8_ - local_100._8_8_);
          pRVar9 = (pointer)local_158._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          pRVar10 = (pointer)local_158._bits._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
        }
      }
    }
    if (pRVar9 != pRVar10) {
      Decode((DecoderResult *)local_100,&local_158._bits);
      BVar8 = QRCode;
      if (local_158._bits._width < 0x15) {
        BVar8 = MicroQRCode;
      }
      format = RMQRCode;
      if (local_158._bits._width == local_158._bits._height) {
        format = BVar8;
      }
      Result::Result(__return_storage_ptr__,(DecoderResult *)local_100,&local_158,format);
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != local_60) {
        operator_delete(local_70._M_p,local_60[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      if (PStack_c8 != (PointT<int>)local_b8) {
        operator_delete((void *)PStack_c8,local_b8[0]._M_allocated_capacity + 1);
      }
      if ((pointer)local_100._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_100._24_8_,local_100._40_8_ - local_100._24_8_);
      }
      pRVar9 = (pointer)local_158._bits._bits.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
      if ((pointer)local_100._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ - local_100._0_8_);
        pRVar9 = (pointer)local_158._bits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
      }
      goto LAB_0018a76e;
    }
  }
  else {
    pRVar6 = __return_storage_ptr__;
    if ((uVar7 >> 0x10 & 1) != 0) goto LAB_0018a4f1;
    if ((uVar7 >> 0x11 & 1) != 0) {
      local_118 = (pointer)0x0;
      pRVar10 = (pointer)0x0;
      pRVar9 = (pointer)0x0;
      goto LAB_0018a5d0;
    }
    pRVar9 = (pointer)0x0;
  }
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_0018a76e:
  if (pRVar9 != (pointer)0x0) {
    operator_delete(pRVar9,(long)local_158._bits._bits.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode Reader::decode(const BinaryBitmap& image) const
{
#if 1
	if (!_opts.isPure())
		return FirstOrDefault(decode(image, 1));
#endif

	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};

	DetectorResult detectorResult;
	if (_opts.hasFormat(BarcodeFormat::QRCode))
		detectorResult = DetectPureQR(*binImg);
	if (_opts.hasFormat(BarcodeFormat::MicroQRCode) && !detectorResult.isValid())
		detectorResult = DetectPureMQR(*binImg);
	if (_opts.hasFormat(BarcodeFormat::RMQRCode) && !detectorResult.isValid())
		detectorResult = DetectPureRMQR(*binImg);

	if (!detectorResult.isValid())
		return {};

	auto decoderResult = Decode(detectorResult.bits());
	auto format = detectorResult.bits().width() != detectorResult.bits().height() ? BarcodeFormat::RMQRCode
				  : detectorResult.bits().width() < 21                            ? BarcodeFormat::MicroQRCode
																				  : BarcodeFormat::QRCode;

	return Barcode(std::move(decoderResult), std::move(detectorResult), format);
}